

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

result_type __thiscall
Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>
::operator()(Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>
             *this)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  sVar3 = this->index_;
  uVar5 = Detail::Modulo<unsigned_long,_1391UL>::calc<unsigned_long>(sVar3 + 0x56e);
  uVar6 = Detail::Modulo<unsigned_long,_1391UL>::calc<unsigned_long>(sVar3 + 0x56d);
  uVar1 = this->state_[uVar5];
  uVar2 = this->state_[uVar6];
  uVar4 = this->state_[sVar3];
  uVar6 = Detail::Modulo<unsigned_long,_1391UL>::calc<unsigned_long>(sVar3 + 0x17);
  uVar8 = uVar4 ^ this->state_[uVar6] ^ (this->state_[uVar6] >> 0x1e | uVar4 << 0x18);
  uVar6 = Detail::Modulo<unsigned_long,_1391UL>::calc<unsigned_long>(sVar3 + 0x1e1);
  uVar4 = this->state_[uVar6];
  uVar6 = Detail::Modulo<unsigned_long,_1391UL>::calc<unsigned_long>(sVar3 + 0xe5);
  uVar4 = this->state_[uVar6] << 0x1a ^ uVar4 << 10 ^ uVar4;
  uVar7 = (uVar4 & 0x7dffff) << 9 | uVar4 >> 0x17;
  uVar9 = uVar7 ^ 0xb729fcec;
  if ((uVar4 >> 0x11 & 1) == 0) {
    uVar9 = uVar7;
  }
  uVar9 = uVar8 >> 0x14 ^ (uVar2 & 0x7fff | uVar1 & 0xffff8000) ^ uVar4 ^ uVar9;
  this->state_[sVar3] = uVar4 ^ uVar8;
  this->state_[uVar5] = uVar9;
  this->index_ = uVar5;
  uVar9 = (uVar9 & 0x127ba28) << 7 ^ uVar9;
  return (uVar9 & 0x1f423) << 0xf ^ uVar9;
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }